

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

ConfigBlockSymbol * __thiscall
slang::ast::Compilation::createConfigBlock
          (Compilation *this,Scope *scope,ConfigDeclarationSyntax *syntax)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  undefined4 uVar4;
  group_type_pointer pgVar5;
  value_type_pointer ppVar6;
  size_t sVar7;
  size_t sVar8;
  pointer ppCVar9;
  group_type_pointer pgVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  ConfigBlockSymbol *pCVar15;
  ulong uVar16;
  uint64_t uVar17;
  SourceLibrary *pSVar18;
  SourceLibrary *pSVar19;
  Diagnostic *this_00;
  value_type *pvVar20;
  uint uVar21;
  uint uVar22;
  pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*> *ppVar23;
  ulong uVar24;
  pointer ppCVar25;
  Compilation *pCVar26;
  value_type *pvVar27;
  long lVar28;
  ulong uVar29;
  pointer ppCVar30;
  ulong uVar31;
  value_type *pvVar32;
  bool bVar33;
  uchar uVar34;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uchar uVar42;
  uchar uVar43;
  uchar uVar44;
  uchar uVar45;
  uchar uVar46;
  uchar uVar47;
  uchar uVar48;
  uchar uVar49;
  uchar uVar50;
  uchar uVar51;
  uchar uVar52;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  uchar uVar53;
  initializer_list<const_slang::ast::ConfigBlockSymbol_*> __l;
  try_emplace_args_t local_f1;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
  *local_f0;
  ConfigBlockSymbol *local_e8;
  pointer local_e0;
  allocator_type local_d1;
  value_type *elements_3;
  ConfigBlockSymbol *local_c8;
  ulong local_c0;
  value_type *elements_2;
  Compilation *local_b0;
  ConfigBlockSymbol *local_a8;
  vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
  local_a0;
  size_t local_88;
  ulong local_80;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_78;
  group_type_pointer local_70;
  undefined8 local_68;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  uchar uStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  uchar uStack_59;
  locator res;
  
  elements_3 = (value_type *)scope;
  pCVar15 = ConfigBlockSymbol::fromSyntax(scope,syntax);
  local_f0 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
              *)&this->configBySyntax;
  local_a0.
  super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(pCVar15->super_Symbol).originatingSyntax;
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       local_a0.
       super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  uVar29 = SUB168(auVar12 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar12 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar16 = uVar29 >> ((byte)(this->configBySyntax).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                            .arrays.groups_size_index & 0x3f);
  pgVar5 = (this->configBySyntax).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
           .arrays.groups_;
  uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar29 & 0xff];
  ppVar6 = (this->configBySyntax).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
           .arrays.elements_;
  local_e0 = (pointer)(this->configBySyntax).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                      .arrays.groups_size_mask;
  ppCVar30 = (pointer)0x0;
  uVar24 = uVar16;
  do {
    pgVar2 = pgVar5 + uVar24;
    uVar34 = (uchar)uVar4;
    auVar40[0] = -(pgVar2->m[0].n == uVar34);
    uVar37 = (uchar)((uint)uVar4 >> 8);
    auVar40[1] = -(pgVar2->m[1].n == uVar37);
    uVar38 = (uchar)((uint)uVar4 >> 0x10);
    auVar40[2] = -(pgVar2->m[2].n == uVar38);
    uVar39 = (uchar)((uint)uVar4 >> 0x18);
    auVar40[3] = -(pgVar2->m[3].n == uVar39);
    auVar40[4] = -(pgVar2->m[4].n == uVar34);
    auVar40[5] = -(pgVar2->m[5].n == uVar37);
    auVar40[6] = -(pgVar2->m[6].n == uVar38);
    auVar40[7] = -(pgVar2->m[7].n == uVar39);
    auVar40[8] = -(pgVar2->m[8].n == uVar34);
    auVar40[9] = -(pgVar2->m[9].n == uVar37);
    auVar40[10] = -(pgVar2->m[10].n == uVar38);
    auVar40[0xb] = -(pgVar2->m[0xb].n == uVar39);
    auVar40[0xc] = -(pgVar2->m[0xc].n == uVar34);
    auVar40[0xd] = -(pgVar2->m[0xd].n == uVar37);
    auVar40[0xe] = -(pgVar2->m[0xe].n == uVar38);
    auVar40[0xf] = -(pgVar2->m[0xf].n == uVar39);
    for (uVar21 = (uint)(ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe); uVar21 != 0;
        uVar21 = uVar21 - 1 & uVar21) {
      iVar14 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> iVar14 & 1) == 0; iVar14 = iVar14 + 1) {
        }
      }
      if ((SyntaxNode *)
          local_a0.
          super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          *(SyntaxNode **)((long)&ppVar6[uVar24 * 0xf].first + (ulong)(uint)(iVar14 << 4))) {
        ppVar23 = (pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>
                   *)((long)&ppVar6[uVar24 * 0xf].first + (ulong)(uint)(iVar14 << 4));
        goto LAB_0013e267;
      }
    }
    if ((pgVar5[uVar24].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar29 & 7]) == 0) break;
    uVar24 = (long)ppCVar30 + uVar24 + 1;
    ppCVar30 = (pointer)((long)ppCVar30 + 1);
    uVar24 = uVar24 & (ulong)local_e0;
  } while (ppCVar30 <= local_e0);
  ppVar23 = (pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*> *)
            0x0;
LAB_0013e267:
  local_e8 = pCVar15;
  local_c8 = pCVar15;
  local_b0 = this;
  if (ppVar23 ==
      (pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*> *)0x0) {
    if ((this->configBySyntax).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
        .size_ctrl.size <
        (this->configBySyntax).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                (&res,local_f0,(arrays_type *)local_f0,uVar16,uVar29,(try_emplace_args_t *)&local_a8
                 ,(SyntaxNode **)&local_a0);
      psVar1 = &(this->configBySyntax).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
      ppVar23 = res.p;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                (&res,local_f0,uVar29,(try_emplace_args_t *)&local_a8,(SyntaxNode **)&local_a0);
      ppVar23 = res.p;
    }
  }
  ppVar23->second = pCVar15;
  sVar7 = (syntax->rules).super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  if (sVar7 != 0) {
    ppCVar30 = (syntax->rules).super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>
               ._M_ptr;
    local_e0 = ppCVar30 + sVar7;
    pCVar26 = this;
    do {
      this = local_b0;
      pCVar15 = local_e8;
      local_a0.
      super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)*ppCVar30;
      auVar13._8_8_ = 0;
      auVar13._0_8_ =
           local_a0.
           super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
      uVar29 = SUB168(auVar13 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar13 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar16 = uVar29 >> ((byte)(pCVar26->configBySyntax).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                                .arrays.groups_size_index & 0x3f);
      pgVar5 = (pCVar26->configBySyntax).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
               .arrays.groups_;
      uVar4 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar29 & 0xff];
      ppVar6 = (pCVar26->configBySyntax).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
               .arrays.elements_;
      local_68 = (pCVar26->configBySyntax).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                 .arrays.groups_size_mask;
      uVar31 = 0;
      uVar24 = uVar16;
      do {
        pgVar2 = pgVar5 + uVar24;
        uVar34 = (uchar)uVar4;
        auVar41[0] = -(pgVar2->m[0].n == uVar34);
        uVar37 = (uchar)((uint)uVar4 >> 8);
        auVar41[1] = -(pgVar2->m[1].n == uVar37);
        uVar38 = (uchar)((uint)uVar4 >> 0x10);
        auVar41[2] = -(pgVar2->m[2].n == uVar38);
        uVar39 = (uchar)((uint)uVar4 >> 0x18);
        auVar41[3] = -(pgVar2->m[3].n == uVar39);
        auVar41[4] = -(pgVar2->m[4].n == uVar34);
        auVar41[5] = -(pgVar2->m[5].n == uVar37);
        auVar41[6] = -(pgVar2->m[6].n == uVar38);
        auVar41[7] = -(pgVar2->m[7].n == uVar39);
        auVar41[8] = -(pgVar2->m[8].n == uVar34);
        auVar41[9] = -(pgVar2->m[9].n == uVar37);
        auVar41[10] = -(pgVar2->m[10].n == uVar38);
        auVar41[0xb] = -(pgVar2->m[0xb].n == uVar39);
        auVar41[0xc] = -(pgVar2->m[0xc].n == uVar34);
        auVar41[0xd] = -(pgVar2->m[0xd].n == uVar37);
        auVar41[0xe] = -(pgVar2->m[0xe].n == uVar38);
        auVar41[0xf] = -(pgVar2->m[0xf].n == uVar39);
        for (uVar21 = (uint)(ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe); uVar21 != 0;
            uVar21 = uVar21 - 1 & uVar21) {
          iVar14 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> iVar14 & 1) == 0; iVar14 = iVar14 + 1) {
            }
          }
          if ((SyntaxNode *)
              local_a0.
              super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              *(SyntaxNode **)((long)&ppVar6[uVar24 * 0xf].first + (ulong)(uint)(iVar14 << 4))) {
            ppVar23 = (pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>
                       *)((long)&ppVar6[uVar24 * 0xf].first + (ulong)(uint)(iVar14 << 4));
            goto LAB_0013e3e8;
          }
        }
        if ((pgVar5[uVar24].m[0xf].n &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar29 & 7]) == 0) break;
        lVar28 = uVar24 + uVar31;
        uVar31 = uVar31 + 1;
        uVar24 = lVar28 + 1U & local_68;
      } while (uVar31 <= local_68);
      ppVar23 = (pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>
                 *)0x0;
LAB_0013e3e8:
      if (ppVar23 ==
          (pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*> *)0x0
         ) {
        if ((local_b0->configBySyntax).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
            .size_ctrl.size <
            (local_b0->configBySyntax).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
            .size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
          ::
          nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                    (&res,local_f0,(arrays_type *)local_f0,uVar16,uVar29,
                     (try_emplace_args_t *)&local_a8,(SyntaxNode **)&local_a0);
          psVar1 = &(this->configBySyntax).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                    .size_ctrl.size;
          *psVar1 = *psVar1 + 1;
          ppVar23 = res.p;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                    (&res,local_f0,uVar29,(try_emplace_args_t *)&local_a8,(SyntaxNode **)&local_a0);
          ppVar23 = res.p;
        }
      }
      ppVar23->second = pCVar15;
      ppCVar30 = ppCVar30 + 1;
      pCVar26 = this;
    } while (ppCVar30 != local_e0);
  }
  if ((pCVar15->super_Symbol).name._M_len != 0) {
    local_c8 = (ConfigBlockSymbol *)&(local_c8->super_Symbol).name;
    local_78 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
               &this->configBlocks;
    uVar17 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       (local_78,(basic_string_view<char,_std::char_traits<char>_> *)local_c8);
    uVar16 = uVar17 >> ((byte)(this->configBlocks).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                              .arrays.groups_size_index & 0x3f);
    local_70 = (this->configBlocks).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
               .arrays.groups_;
    lVar28 = (uVar17 & 0xff) * 4;
    uVar34 = (&UNK_0046cabc)[lVar28];
    uVar37 = (&UNK_0046cabd)[lVar28];
    uVar38 = (&UNK_0046cabe)[lVar28];
    uVar39 = (&UNK_0046cabf)[lVar28];
    elements_2 = (this->configBlocks).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                 .arrays.elements_;
    sVar8 = (pCVar15->super_Symbol).name._M_len;
    local_e0 = (pointer)(pCVar15->super_Symbol).name._M_str;
    local_f0 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
                *)(ulong)((uint)uVar17 & 7);
    local_88 = (this->configBlocks).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
               .arrays.groups_size_mask;
    uVar24 = 0;
    uVar42 = uVar34;
    uVar43 = uVar37;
    uVar44 = uVar38;
    uVar45 = uVar39;
    uVar46 = uVar34;
    uVar47 = uVar37;
    uVar48 = uVar38;
    uVar49 = uVar39;
    uVar50 = uVar34;
    uVar51 = uVar37;
    uVar52 = uVar38;
    uVar53 = uVar39;
    do {
      pvVar20 = elements_2;
      pgVar10 = local_70 + uVar16;
      auVar35[0] = -(pgVar10->m[0].n == uVar34);
      auVar35[1] = -(pgVar10->m[1].n == uVar37);
      auVar35[2] = -(pgVar10->m[2].n == uVar38);
      auVar35[3] = -(pgVar10->m[3].n == uVar39);
      auVar35[4] = -(pgVar10->m[4].n == uVar42);
      auVar35[5] = -(pgVar10->m[5].n == uVar43);
      auVar35[6] = -(pgVar10->m[6].n == uVar44);
      auVar35[7] = -(pgVar10->m[7].n == uVar45);
      auVar35[8] = -(pgVar10->m[8].n == uVar46);
      auVar35[9] = -(pgVar10->m[9].n == uVar47);
      auVar35[10] = -(pgVar10->m[10].n == uVar48);
      auVar35[0xb] = -(pgVar10->m[0xb].n == uVar49);
      auVar35[0xc] = -(pgVar10->m[0xc].n == uVar50);
      auVar35[0xd] = -(pgVar10->m[0xd].n == uVar51);
      auVar35[0xe] = -(pgVar10->m[0xe].n == uVar52);
      auVar35[0xf] = -(pgVar10->m[0xf].n == uVar53);
      uVar21 = (uint)(ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe);
      local_c0 = uVar16;
      local_80 = uVar24;
      if (uVar21 != 0) {
        local_68._0_2_ = CONCAT11(uVar37,uVar34);
        local_68._0_3_ = CONCAT12(uVar38,(undefined2)local_68);
        local_68._0_4_ = CONCAT13(uVar39,(undefined3)local_68);
        local_68._0_5_ = CONCAT14(uVar42,(undefined4)local_68);
        local_68._0_6_ = CONCAT15(uVar43,(undefined5)local_68);
        local_68._0_7_ = CONCAT16(uVar44,(undefined6)local_68);
        local_68 = CONCAT17(uVar45,(undefined7)local_68);
        uStack_60 = uVar46;
        uStack_5f = uVar47;
        uStack_5e = uVar48;
        uStack_5d = uVar49;
        uStack_5c = uVar50;
        uStack_5b = uVar51;
        uStack_5a = uVar52;
        uStack_59 = uVar53;
        do {
          uVar22 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
            }
          }
          bVar33 = sVar8 == pvVar20[uVar16 * 0xf + (ulong)uVar22].first._M_len;
          pvVar32 = pvVar20 + uVar16 * 0xf + (ulong)uVar22;
          if (bVar33 && sVar8 != 0) {
            iVar14 = bcmp(local_e0,(pvVar32->first)._M_str,sVar8);
            bVar33 = iVar14 == 0;
            uVar34 = (uchar)local_68;
            uVar37 = local_68._1_1_;
            uVar38 = local_68._2_1_;
            uVar39 = local_68._3_1_;
            uVar42 = local_68._4_1_;
            uVar43 = local_68._5_1_;
            uVar44 = local_68._6_1_;
            uVar45 = local_68._7_1_;
            uVar46 = uStack_60;
            uVar47 = uStack_5f;
            uVar48 = uStack_5e;
            uVar49 = uStack_5d;
            uVar50 = uStack_5c;
            uVar51 = uStack_5b;
            uVar52 = uStack_5a;
            uVar53 = uStack_59;
          }
          pCVar15 = local_e8;
          if (bVar33) goto LAB_0013e636;
          uVar21 = uVar21 - 1 & uVar21;
        } while (uVar21 != 0);
      }
      if ((local_70[uVar16].m[0xf].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(long)local_f0]) == 0) {
        pvVar32 = (value_type *)0x0;
        goto LAB_0013e636;
      }
      uVar24 = local_80 + 1;
      uVar16 = local_c0 + local_80 + 1 & local_88;
    } while (uVar24 <= local_88);
    pvVar32 = (value_type *)0x0;
LAB_0013e636:
    pvVar20 = elements_3;
    if (pvVar32 == (value_type *)0x0) {
      __l._M_len = 1;
      __l._M_array = &local_a8;
      local_a8 = pCVar15;
      std::
      vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
      ::vector(&local_a0,__l,&local_d1);
      pvVar20 = (value_type *)
                hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                          (local_78,(basic_string_view<char,_std::char_traits<char>_> *)local_c8);
      uVar24 = (ulong)pvVar20 >>
               ((byte)(local_b0->configBlocks).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                      .arrays.groups_size_index & 0x3f);
      pgVar10 = (local_b0->configBlocks).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                .arrays.groups_;
      lVar28 = ((ulong)pvVar20 & 0xff) * 4;
      uVar34 = (&UNK_0046cabc)[lVar28];
      uVar37 = (&UNK_0046cabd)[lVar28];
      uVar38 = (&UNK_0046cabe)[lVar28];
      uVar39 = (&UNK_0046cabf)[lVar28];
      elements_3 = (local_b0->configBlocks).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                   .arrays.elements_;
      sVar8 = (pCVar15->super_Symbol).name._M_len;
      local_e0 = (pointer)(pCVar15->super_Symbol).name._M_str;
      uVar21 = (uint)pvVar20;
      local_88 = (local_b0->configBlocks).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                 .arrays.groups_size_mask;
      local_c0 = 0;
      pCVar26 = local_b0;
      uVar42 = uVar34;
      uVar43 = uVar37;
      uVar44 = uVar38;
      uVar45 = uVar39;
      uVar46 = uVar34;
      uVar47 = uVar37;
      uVar48 = uVar38;
      uVar49 = uVar39;
      uVar50 = uVar34;
      uVar51 = uVar37;
      uVar52 = uVar38;
      uVar53 = uVar39;
      local_70 = (group_type_pointer)uVar24;
      do {
        pvVar32 = elements_3;
        local_f0 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
                    *)(uVar24 * 0x10);
        pgVar3 = pgVar10 + uVar24;
        auVar36[0] = -(pgVar3->m[0].n == uVar34);
        auVar36[1] = -(pgVar3->m[1].n == uVar37);
        auVar36[2] = -(pgVar3->m[2].n == uVar38);
        auVar36[3] = -(pgVar3->m[3].n == uVar39);
        auVar36[4] = -(pgVar3->m[4].n == uVar42);
        auVar36[5] = -(pgVar3->m[5].n == uVar43);
        auVar36[6] = -(pgVar3->m[6].n == uVar44);
        auVar36[7] = -(pgVar3->m[7].n == uVar45);
        auVar36[8] = -(pgVar3->m[8].n == uVar46);
        auVar36[9] = -(pgVar3->m[9].n == uVar47);
        auVar36[10] = -(pgVar3->m[10].n == uVar48);
        auVar36[0xb] = -(pgVar3->m[0xb].n == uVar49);
        auVar36[0xc] = -(pgVar3->m[0xc].n == uVar50);
        auVar36[0xd] = -(pgVar3->m[0xd].n == uVar51);
        auVar36[0xe] = -(pgVar3->m[0xe].n == uVar52);
        auVar36[0xf] = -(pgVar3->m[0xf].n == uVar53);
        uVar22 = (uint)(ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe);
        local_80 = uVar24;
        if (uVar22 != 0) {
          local_68._0_2_ = CONCAT11(uVar37,uVar34);
          local_68._0_3_ = CONCAT12(uVar38,(undefined2)local_68);
          local_68._0_4_ = CONCAT13(uVar39,(undefined3)local_68);
          local_68._0_5_ = CONCAT14(uVar42,(undefined4)local_68);
          local_68._0_6_ = CONCAT15(uVar43,(undefined5)local_68);
          local_68._0_7_ = CONCAT16(uVar44,(undefined6)local_68);
          local_68 = CONCAT17(uVar45,(undefined7)local_68);
          elements_2 = pvVar20;
          uStack_60 = uVar46;
          uStack_5f = uVar47;
          uStack_5e = uVar48;
          uStack_5d = uVar49;
          uStack_5c = uVar50;
          uStack_5b = uVar51;
          uStack_5a = uVar52;
          uStack_59 = uVar53;
          do {
            uVar11 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
              }
            }
            bVar33 = sVar8 == pvVar32[uVar24 * 0xf + (ulong)uVar11].first._M_len;
            pvVar27 = pvVar32 + uVar24 * 0xf + (ulong)uVar11;
            if (bVar33 && sVar8 != 0) {
              iVar14 = bcmp(local_e0,(pvVar27->first)._M_str,sVar8);
              bVar33 = iVar14 == 0;
              uVar34 = (uchar)local_68;
              uVar37 = local_68._1_1_;
              uVar38 = local_68._2_1_;
              uVar39 = local_68._3_1_;
              uVar42 = local_68._4_1_;
              uVar43 = local_68._5_1_;
              uVar44 = local_68._6_1_;
              uVar45 = local_68._7_1_;
              uVar46 = uStack_60;
              uVar47 = uStack_5f;
              uVar48 = uStack_5e;
              uVar49 = uStack_5d;
              uVar50 = uStack_5c;
              uVar51 = uStack_5b;
              uVar52 = uStack_5a;
              uVar53 = uStack_59;
            }
            pCVar26 = local_b0;
            pvVar20 = elements_2;
            pCVar15 = local_e8;
            if (bVar33) goto LAB_0013e8a0;
            uVar22 = uVar22 - 1 & uVar22;
          } while (uVar22 != 0);
        }
        if ((pgVar10->m[(long)local_f0 + 0xf].n &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[uVar21 & 7]) == 0) break;
        lVar28 = local_80 + local_c0;
        local_c0 = local_c0 + 1;
        uVar24 = lVar28 + 1U & local_88;
      } while (local_c0 <= local_88);
      pvVar27 = (value_type *)0x0;
LAB_0013e8a0:
      if (pvVar27 == (value_type *)0x0) {
        if ((pCVar26->configBlocks).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
            .size_ctrl.size <
            (pCVar26->configBlocks).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
            .size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>>>
          ::
          nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>
                    ((locator *)&res,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>>>
                      *)local_78,(arrays_type *)local_78,(size_t)local_70,(size_t)pvVar20,&local_f1,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_c8,&local_a0);
          psVar1 = &(pCVar26->configBlocks).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                    .size_ctrl.size;
          *psVar1 = *psVar1 + 1;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>
                    ((locator *)&res,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>>>
                      *)local_78,(size_t)pvVar20,&local_f1,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_c8,&local_a0);
        }
      }
      if ((SyntaxNode *)
          local_a0.
          super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (SyntaxNode *)0x0) {
        operator_delete(local_a0.
                        super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a0.
                              super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.
                              super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      pSVar18 = Symbol::getSourceLibrary((Symbol *)(elements_3->first)._M_str);
      ppCVar25 = (pvVar32->second).
                 super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppCVar9 = (pvVar32->second).
                super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      while ((ppCVar25 != ppCVar9 &&
             (pSVar19 = Symbol::getSourceLibrary(&(*ppCVar25)->super_Symbol), pSVar19 != pSVar18)))
      {
        ppCVar25 = ppCVar25 + 1;
      }
      if (ppCVar25 ==
          (pvVar32->second).
          super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)pCVar15;
        std::
        vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>
        ::emplace_back<slang::ast::ConfigBlockSymbol*>
                  ((vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>
                    *)&pvVar32->second,(ConfigBlockSymbol **)&res);
      }
      else {
        this_00 = Scope::addDiag((Scope *)pvVar20,(DiagCode)0x2a000a,
                                 (pCVar15->super_Symbol).location);
        Diagnostic::operator<<(this_00,(pCVar15->super_Symbol).name);
        Diagnostic::addNote(this_00,(DiagCode)0xa0001,((*ppCVar25)->super_Symbol).location);
      }
    }
  }
  return pCVar15;
}

Assistant:

const ConfigBlockSymbol& Compilation::createConfigBlock(const Scope& scope,
                                                        const ConfigDeclarationSyntax& syntax) {
    SLANG_ASSERT(!isFrozen());

    auto& config = ConfigBlockSymbol::fromSyntax(scope, syntax);

    // Register lookups by syntax node. Note that we register rule entries here
    // by looking directly at the syntax so that we don't trigger resolution
    // of the config block early, which could cause spurious errors.
    configBySyntax[config.getSyntax()] = &config;
    for (auto ruleSyntax : syntax.rules)
        configBySyntax[ruleSyntax] = &config;

    if (!config.name.empty()) {
        auto it = configBlocks.find(config.name);
        if (it == configBlocks.end()) {
            configBlocks.emplace(config.name, std::vector<const ConfigBlockSymbol*>{&config});
        }
        else {
            auto configLib = scope.asSymbol().getSourceLibrary();
            auto findIt = std::ranges::find_if(it->second, [&](const ConfigBlockSymbol* elem) {
                return elem->getSourceLibrary() == configLib;
            });

            if (findIt != it->second.end()) {
                auto& diag = scope.addDiag(diag::Redefinition, config.location);
                diag << config.name;
                diag.addNote(diag::NotePreviousDefinition, (*findIt)->location);
            }
            else {
                it->second.emplace_back(&config);
            }
        }
    }

    return config;
}